

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# methods.cpp
# Opt level: O2

rotation_t *
opengv::relative_pose::twopt_rotationOnly
          (rotation_t *__return_storage_ptr__,RelativeAdapterBase *adapter,size_t index0,
          size_t index1)

{
  MatrixXd Hcross;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  local_c0;
  Vector3d fprime;
  Vector3d f;
  Matrix<double,_3,_1,_0,_3,_1> local_78;
  Vector3d pointsCenter2;
  Vector3d pointsCenter1;
  
  (*adapter->_vptr_RelativeAdapterBase[2])();
  (*adapter->_vptr_RelativeAdapterBase[2])(&f,adapter,index1);
  Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)&pointsCenter2;
  Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
       (Index)&f;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&pointsCenter1,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)&Hcross);
  (*adapter->_vptr_RelativeAdapterBase[3])(&f,adapter,index0);
  (*adapter->_vptr_RelativeAdapterBase[3])(&fprime,adapter,index1);
  Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)&f;
  Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
       (Index)&fprime;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&pointsCenter2,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)&Hcross);
  Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       0x4008000000000000;
  Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)&pointsCenter1;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)&pointsCenter1,
             (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)&Hcross);
  Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       0x4008000000000000;
  Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)&pointsCenter2;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)&pointsCenter2,
             (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)&Hcross);
  f.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]._0_4_ = 3
  ;
  fprime.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       (double)CONCAT44(fprime.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                        m_storage.m_data.array[0]._4_4_,3);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,0,_1,_1> *)&Hcross,(int *)&f,(int *)&fprime);
  f.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] = 0.0;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>>>
            (&Hcross,(CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                      *)&f);
  (*adapter->_vptr_RelativeAdapterBase[2])(&local_c0,adapter,index0);
  fprime.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       (double)&local_c0;
  fprime.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       (double)&pointsCenter1;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&f,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)&fprime);
  (*adapter->_vptr_RelativeAdapterBase[3])(&local_78,adapter,index0);
  local_c0.m_lhs = &local_78;
  local_c0.m_rhs = (RhsNested)&pointsCenter2;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&fprime,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)&local_c0);
  local_c0.m_lhs = (LhsNested)&fprime;
  local_c0.m_rhs = (RhsNested)&f;
  Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator+=
            ((MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&Hcross,
             (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_0>_>
              *)&local_c0);
  (*adapter->_vptr_RelativeAdapterBase[2])(&local_78,adapter,index1);
  local_c0.m_lhs = &local_78;
  local_c0.m_rhs = &pointsCenter1;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            (&f,&local_c0);
  (*adapter->_vptr_RelativeAdapterBase[3])(&local_78,adapter,index1);
  local_c0.m_lhs = &local_78;
  local_c0.m_rhs = (RhsNested)&pointsCenter2;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            (&fprime,&local_c0);
  local_c0.m_lhs = &fprime;
  local_c0.m_rhs = &f;
  Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator+=
            ((MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&Hcross,
             (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_0>_>
              *)&local_c0);
  math::arun(__return_storage_ptr__,&Hcross);
  Eigen::internal::handmade_aligned_free
            (Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_data);
  return __return_storage_ptr__;
}

Assistant:

opengv::rotation_t
opengv::relative_pose::twopt_rotationOnly(
    const RelativeAdapterBase & adapter,
    size_t index0,
    size_t index1)
{
  Eigen::Vector3d pointsCenter1 =
      adapter.getBearingVector1(index0) + adapter.getBearingVector1(index1);
  Eigen::Vector3d pointsCenter2 =
      adapter.getBearingVector2(index0) + adapter.getBearingVector2(index1);
  pointsCenter1 = pointsCenter1/3.0;
  pointsCenter2 = pointsCenter2/3.0;

  Eigen::MatrixXd Hcross(3,3);
  Hcross = Eigen::Matrix3d::Zero();

  Eigen::Vector3d f = adapter.getBearingVector1(index0) - pointsCenter1;
  Eigen::Vector3d fprime = adapter.getBearingVector2(index0) - pointsCenter2;
  Hcross += fprime * f.transpose();
  f = adapter.getBearingVector1(index1) - pointsCenter1;
  fprime = adapter.getBearingVector2(index1) - pointsCenter2;
  Hcross += fprime * f.transpose();

  return math::arun(Hcross);
}